

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signmessage.cpp
# Opt level: O2

RPCHelpMan * signmessagewithprivkey(void)

{
  string name;
  string name_00;
  string m_key_name;
  RPCResult result;
  string description;
  string description_00;
  Fallback fallback;
  Fallback fallback_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  string description_01;
  string description_02;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  long lVar1;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  undefined8 in_stack_fffffffffffff868;
  undefined8 in_stack_fffffffffffff870;
  undefined8 in_stack_fffffffffffff878;
  undefined8 in_stack_fffffffffffff880;
  _Manager_type in_stack_fffffffffffff888;
  undefined8 in_stack_fffffffffffff890;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff898;
  pointer in_stack_fffffffffffff8a8;
  pointer pRVar2;
  pointer in_stack_fffffffffffff8b0;
  pointer pRVar3;
  pointer in_stack_fffffffffffff8b8;
  pointer pRVar4;
  _Vector_impl_data in_stack_fffffffffffff8c0;
  undefined1 in_stack_fffffffffffff8d8 [16];
  pointer in_stack_fffffffffffff8e8;
  pointer in_stack_fffffffffffff8f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff8f8;
  undefined1 in_stack_fffffffffffff908 [16];
  undefined1 in_stack_fffffffffffff918 [56];
  string local_698;
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  char *local_538;
  size_type local_530;
  char local_528 [8];
  undefined8 uStack_520;
  string local_518 [32];
  string local_4f8 [32];
  RPCResult local_4d8;
  RPCArgOptions local_450;
  string local_408 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_3e8;
  undefined1 local_390;
  string local_388 [32];
  RPCArgOptions local_368;
  string local_320 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_300;
  undefined1 local_2a8;
  string local_2a0 [32];
  RPCArg local_280 [2];
  string local_70 [32];
  string local_50 [32];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"signmessagewithprivkey",(allocator<char> *)&stack0xfffffffffffff907);
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"\nSign a message with the private key of an address\n",
             (allocator<char> *)&stack0xfffffffffffff906);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2a0,"privkey",(allocator<char> *)&stack0xfffffffffffff8e7);
  local_300._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_2a8 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_320,"The private key to sign the message with.",
             (allocator<char> *)&stack0xfffffffffffff8e6);
  local_368.oneline_description._M_dataplus._M_p = (pointer)&local_368.oneline_description.field_2;
  local_368.skip_type_check = false;
  local_368.oneline_description._M_string_length = 0;
  local_368.oneline_description.field_2._M_local_buf[0] = '\0';
  local_368.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_368.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_368.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_368.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_368._58_8_ = 0;
  name._M_string_length = in_stack_fffffffffffff870;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff868;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff878;
  name.field_2._8_8_ = in_stack_fffffffffffff880;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff890;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff888;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff898;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff8a8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff8b0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff8b8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff8c0._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff8c0._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff8c0._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff8d8;
  description_01._M_string_length = (size_type)in_stack_fffffffffffff8f0;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8e8;
  description_01.field_2 = in_stack_fffffffffffff8f8;
  opts.oneline_description._M_string_length = in_stack_fffffffffffff918._0_8_;
  opts.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffff918._8_16_;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff918._24_24_;
  opts.hidden = (bool)in_stack_fffffffffffff918[0x30];
  opts.also_positional = (bool)in_stack_fffffffffffff918[0x31];
  opts._66_6_ = in_stack_fffffffffffff918._50_6_;
  opts.skip_type_check = (bool)in_stack_fffffffffffff908[0];
  opts._1_7_ = in_stack_fffffffffffff908._1_7_;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff908._8_8_;
  RPCArg::RPCArg(local_280,name,(Type)local_2a0,fallback,description_01,opts);
  std::__cxx11::string::string<std::allocator<char>>
            (local_388,"message",(allocator<char> *)&stack0xfffffffffffff8e5);
  local_3e8._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_390 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_408,"The message to create a signature of.",
             (allocator<char> *)&stack0xfffffffffffff8e4);
  local_450.oneline_description._M_dataplus._M_p = (pointer)&local_450.oneline_description.field_2;
  local_450.skip_type_check = false;
  local_450.oneline_description._M_string_length = 0;
  local_450.oneline_description.field_2._M_local_buf[0] = '\0';
  local_450.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_450.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_450.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_450.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_450._58_8_ = 0;
  name_00._M_string_length = in_stack_fffffffffffff870;
  name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff868;
  name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff878;
  name_00.field_2._8_8_ = in_stack_fffffffffffff880;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff890;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff888;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff898;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff8a8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff8b0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff8b8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff8c0._M_start;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff8c0._M_finish;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff8c0._M_end_of_storage;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff8d8;
  description_02._M_string_length = (size_type)in_stack_fffffffffffff8f0;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8e8;
  description_02.field_2 = in_stack_fffffffffffff8f8;
  opts_00.oneline_description._M_string_length = in_stack_fffffffffffff918._0_8_;
  opts_00.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffff918._8_16_;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff918._24_24_;
  opts_00.hidden = (bool)in_stack_fffffffffffff918[0x30];
  opts_00.also_positional = (bool)in_stack_fffffffffffff918[0x31];
  opts_00._66_6_ = in_stack_fffffffffffff918._50_6_;
  opts_00.skip_type_check = (bool)in_stack_fffffffffffff908[0];
  opts_00._1_7_ = in_stack_fffffffffffff908._1_7_;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff908._8_8_;
  RPCArg::RPCArg(local_280 + 1,name_00,(Type)local_388,fallback_00,description_02,opts_00);
  __l._M_len = 2;
  __l._M_array = local_280;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff8e8,__l,
             (allocator_type *)&stack0xfffffffffffff8e3);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4f8,"signature",(allocator<char> *)&stack0xfffffffffffff8c7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_518,"The signature of the message encoded in base 64",
             (allocator<char> *)&stack0xfffffffffffff8c6);
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  pRVar4 = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffff870;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff868;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff878;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff880;
  description._M_string_length = in_stack_fffffffffffff890;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff888;
  description.field_2 = in_stack_fffffffffffff898;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_4d8,STR,m_key_name,description,inner,SUB81(local_4f8,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff870;
  result._0_8_ = in_stack_fffffffffffff868;
  result.m_key_name._M_string_length = in_stack_fffffffffffff878;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff880;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff888;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff890;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff898;
  result._64_8_ = pRVar2;
  result.m_description._M_dataplus._M_p = (pointer)pRVar3;
  result.m_description._M_string_length = (size_type)pRVar4;
  result._88_24_ = in_stack_fffffffffffff8c0;
  result.m_cond._8_16_ = in_stack_fffffffffffff8d8;
  result.m_cond.field_2._8_8_ = in_stack_fffffffffffff8e8;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffff8c8,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_618,"signmessagewithprivkey",
             (allocator<char> *)&stack0xfffffffffffff8a7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_638,"\"privkey\" \"my message\"",
             (allocator<char> *)&stack0xfffffffffffff8a6);
  HelpExampleCli(&local_5f8,&local_618,&local_638);
  std::operator+(&local_5d8,"\nCreate the signature\n",&local_5f8);
  std::operator+(&local_5b8,&local_5d8,"\nVerify the signature\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_678,"verifymessage",(allocator<char> *)&stack0xfffffffffffff8a5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_698,
             "\"1D1ZrZNe3JUo7ZycKEYQQiQAWd9y54F4XX\" \"signature\" \"my message\"",
             (allocator<char> *)&stack0xfffffffffffff8a4);
  HelpExampleCli(&local_658,&local_678,&local_698);
  std::operator+(&local_598,&local_5b8,&local_658);
  std::operator+(&local_578,&local_598,"\nAs a JSON-RPC call\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffff928,"signmessagewithprivkey",
             (allocator<char> *)&stack0xfffffffffffff8a3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffff908,"\"privkey\", \"my message\"",
             (allocator<char> *)&stack0xfffffffffffff8a2);
  HelpExampleRpc((string *)&stack0xfffffffffffff948,(string *)&stack0xfffffffffffff928,
                 (string *)&stack0xfffffffffffff908);
  std::operator+(&local_558,&local_578,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffff948);
  local_538 = local_528;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._M_dataplus._M_p == &local_558.field_2) {
    uStack_520 = local_558.field_2._8_8_;
  }
  else {
    local_538 = local_558._M_dataplus._M_p;
  }
  local_530 = local_558._M_string_length;
  local_558._M_string_length = 0;
  local_558.field_2._M_local_buf[0] = '\0';
  description_00._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/signmessage.cpp:83:9)>
       ::_M_invoke;
  description_00._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/signmessage.cpp:83:9)>
                ::_M_manager;
  description_00.field_2 = in_stack_fffffffffffff898;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar3;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar2;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar4;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff8e8;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8d8._0_8_;
  examples.m_examples._M_string_length = in_stack_fffffffffffff8d8._8_8_;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffff8f0;
  fun.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffff908._0_8_;
  fun._M_invoker = (_Invoker_type)in_stack_fffffffffffff908._8_8_;
  fun.super__Function_base._M_functor._M_pod_data = in_stack_fffffffffffff8f8._M_local_buf;
  local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff870,&stack0xfffffffffffff878)),
             description_00,args,(RPCResults)in_stack_fffffffffffff8c0,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff878);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff948);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff908);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff928);
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::~string((string *)&local_598);
  std::__cxx11::string::~string((string *)&local_658);
  std::__cxx11::string::~string((string *)&local_698);
  std::__cxx11::string::~string((string *)&local_678);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::__cxx11::string::~string((string *)&local_638);
  std::__cxx11::string::~string((string *)&local_618);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff8c8);
  RPCResult::~RPCResult(&local_4d8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff8a8);
  std::__cxx11::string::~string(local_518);
  std::__cxx11::string::~string(local_4f8);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff8e8);
  lVar1 = 0x108;
  do {
    RPCArg::~RPCArg((RPCArg *)((long)&local_280[0].m_names._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x108;
  } while (lVar1 != -0x108);
  RPCArgOptions::~RPCArgOptions(&local_450);
  std::__cxx11::string::~string(local_408);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_3e8._M_first);
  std::__cxx11::string::~string(local_388);
  RPCArgOptions::~RPCArgOptions(&local_368);
  std::__cxx11::string::~string(local_320);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_300._M_first);
  std::__cxx11::string::~string(local_2a0);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan signmessagewithprivkey()
{
    return RPCHelpMan{"signmessagewithprivkey",
        "\nSign a message with the private key of an address\n",
        {
            {"privkey", RPCArg::Type::STR, RPCArg::Optional::NO, "The private key to sign the message with."},
            {"message", RPCArg::Type::STR, RPCArg::Optional::NO, "The message to create a signature of."},
        },
        RPCResult{
            RPCResult::Type::STR, "signature", "The signature of the message encoded in base 64"
        },
        RPCExamples{
            "\nCreate the signature\n"
            + HelpExampleCli("signmessagewithprivkey", "\"privkey\" \"my message\"") +
            "\nVerify the signature\n"
            + HelpExampleCli("verifymessage", "\"1D1ZrZNe3JUo7ZycKEYQQiQAWd9y54F4XX\" \"signature\" \"my message\"") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("signmessagewithprivkey", "\"privkey\", \"my message\"")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            std::string strPrivkey = request.params[0].get_str();
            std::string strMessage = request.params[1].get_str();

            CKey key = DecodeSecret(strPrivkey);
            if (!key.IsValid()) {
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid private key");
            }

            std::string signature;

            if (!MessageSign(key, strMessage, signature)) {
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Sign failed");
            }

            return signature;
        },
    };
}